

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example.c
# Opt level: O2

void test_sync(Byte *compr,uLong comprLen,Byte *uncompr,uLong uncomprLen)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Byte *local_90;
  int local_88;
  Byte *local_78;
  undefined4 local_70;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  
  builtin_memcpy(uncompr,"garbage",8);
  local_40 = 0;
  local_50 = 0;
  uStack_48 = 0;
  local_88 = 2;
  local_90 = compr;
  uVar1 = inflateInit_(&local_90,"1.2.8",0x70);
  if (uVar1 == 0) {
    local_70 = (undefined4)uncomprLen;
    local_78 = uncompr;
    inflate(&local_90,0);
    local_88 = (int)comprLen + -2;
    uVar1 = inflateSync(&local_90);
    if (uVar1 == 0) {
      iVar2 = inflate(&local_90,4);
      if (iVar2 != -3) {
        fwrite("inflate should report DATA_ERROR\n",0x21,1,_stderr);
        goto LAB_00102e92;
      }
      uVar1 = inflateEnd(&local_90);
      if (uVar1 == 0) {
        printf("after inflateSync(): hel%s\n",uncompr);
        return;
      }
      pcVar3 = "inflateEnd";
    }
    else {
      pcVar3 = "inflateSync";
    }
  }
  else {
    pcVar3 = "inflateInit";
  }
  fprintf(_stderr,"%s error: %d\n",pcVar3,(ulong)uVar1);
LAB_00102e92:
  exit(1);
}

Assistant:

void test_sync(compr, comprLen, uncompr, uncomprLen)
    Byte *compr, *uncompr;
    uLong comprLen, uncomprLen;
{
    int err;
    z_stream d_stream; /* decompression stream */

    strcpy((char*)uncompr, "garbage");

    d_stream.zalloc = zalloc;
    d_stream.zfree = zfree;
    d_stream.opaque = (voidpf)0;

    d_stream.next_in  = compr;
    d_stream.avail_in = 2; /* just read the zlib header */

    err = inflateInit(&d_stream);
    CHECK_ERR(err, "inflateInit");

    d_stream.next_out = uncompr;
    d_stream.avail_out = (uInt)uncomprLen;

    inflate(&d_stream, Z_NO_FLUSH);
    CHECK_ERR(err, "inflate");

    d_stream.avail_in = (uInt)comprLen-2;   /* read all compressed data */
    err = inflateSync(&d_stream);           /* but skip the damaged part */
    CHECK_ERR(err, "inflateSync");

    err = inflate(&d_stream, Z_FINISH);
    if (err != Z_DATA_ERROR) {
        fprintf(stderr, "inflate should report DATA_ERROR\n");
        /* Because of incorrect adler32 */
        exit(1);
    }
    err = inflateEnd(&d_stream);
    CHECK_ERR(err, "inflateEnd");

    printf("after inflateSync(): hel%s\n", (char *)uncompr);
}